

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O1

int cipher_get_params(EVP_CIPHER *c,OSSL_PARAM *params)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  
  lVar2 = OSSL_PARAM_locate(params,"blocksize");
  if (lVar2 == 0) {
LAB_0011179e:
    lVar2 = OSSL_PARAM_locate(params,"ivlen");
    if (lVar2 != 0) {
      iVar1 = EVP_CIPHER_get_iv_length(c);
      iVar1 = OSSL_PARAM_set_size_t(lVar2,(long)iVar1);
      if (iVar1 == 0) goto LAB_0011182f;
    }
    lVar2 = OSSL_PARAM_locate(params,"keylen");
    if (lVar2 != 0) {
      iVar1 = EVP_CIPHER_get_key_length(c);
      iVar1 = OSSL_PARAM_set_size_t(lVar2,(long)iVar1);
      if (iVar1 == 0) goto LAB_0011182f;
    }
    lVar2 = OSSL_PARAM_locate(params,"mode");
    if (lVar2 != 0) {
      uVar3 = EVP_CIPHER_get_flags(c);
      iVar1 = OSSL_PARAM_set_size_t(lVar2,uVar3);
      if (iVar1 == 0) goto LAB_0011182f;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = EVP_CIPHER_get_block_size(c);
    iVar1 = OSSL_PARAM_set_size_t(lVar2,(long)iVar1);
    if (iVar1 != 0) goto LAB_0011179e;
LAB_0011182f:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int cipher_get_params(EVP_CIPHER *c, OSSL_PARAM params[])
{
    OSSL_PARAM *p;

    if (((p = OSSL_PARAM_locate(params, "blocksize")) != NULL
         && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_block_size(c)))
        || ((p = OSSL_PARAM_locate(params, "ivlen")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_iv_length(c)))
        || ((p = OSSL_PARAM_locate(params, "keylen")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_key_length(c)))
        || ((p = OSSL_PARAM_locate(params, "mode")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_CIPHER_flags(c))))
        return 0;
    return 1;
}